

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSResolveResultEnum
js_resolve_export1(JSContext *ctx,JSModuleDef **pmodule,JSExportEntry **pme,JSModuleDef *m,
                  JSAtom export_name,JSResolveState *s)

{
  int iVar1;
  JSResolveResultEnum JVar2;
  JSModuleDef *s_00;
  JSModuleDef *in_RCX;
  JSModuleDef **in_RDX;
  JSContext *in_RSI;
  JSContext *in_RDI;
  JSAtom in_R8D;
  JSResolveState *in_R9;
  JSResolveResultEnum ret;
  JSExportEntry *res_me;
  JSModuleDef *res_m;
  JSModuleDef *m1_1;
  JSStarExportEntry *se;
  int i;
  JSModuleDef *m1;
  JSExportEntry *me;
  undefined4 local_70;
  JSAtom in_stack_ffffffffffffff94;
  JSModuleDef *in_stack_ffffffffffffff98;
  JSResolveState *in_stack_ffffffffffffffa0;
  JSContext *in_stack_ffffffffffffffa8;
  int local_4c;
  JSResolveState *s_01;
  undefined4 in_stack_ffffffffffffffd0;
  JSResolveResultEnum local_4;
  
  (in_RSI->header).ref_count = 0;
  (in_RSI->header).field_0x4 = 0;
  (in_RSI->header).dummy1 = '\0';
  (in_RSI->header).dummy2 = 0;
  *in_RDX = (JSModuleDef *)0x0;
  iVar1 = find_resolve_entry(in_R9,in_RCX,in_R8D);
  if (iVar1 < 0) {
    iVar1 = add_resolve_entry(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                              in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    if (iVar1 < 0) {
      local_4 = JS_RESOLVE_RES_EXCEPTION;
    }
    else {
      s_00 = (JSModuleDef *)find_export_entry(in_RDI,in_RCX,in_R8D);
      if (s_00 == (JSModuleDef *)0x0) {
        if (in_R8D != 0x16) {
          s_01 = (JSResolveState *)0x0;
          for (local_4c = 0; local_4c < in_RCX->star_export_entries_count; local_4c = local_4c + 1)
          {
            JVar2 = js_resolve_export1(in_RSI,in_RDX,(JSExportEntry **)in_RCX,
                                       (JSModuleDef *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                                       (JSAtom)((ulong)in_R9 >> 0x20),s_01);
            if (JVar2 == JS_RESOLVE_RES_AMBIGUOUS) {
              return JS_RESOLVE_RES_AMBIGUOUS;
            }
            if (JVar2 == JS_RESOLVE_RES_EXCEPTION) {
              return JS_RESOLVE_RES_EXCEPTION;
            }
            if (JVar2 == JS_RESOLVE_RES_FOUND) {
              if (*in_RDX == (JSModuleDef *)0x0) {
                *(JSModuleDef **)&in_RSI->header = in_stack_ffffffffffffff98;
                *in_RDX = (JSModuleDef *)CONCAT44(in_stack_ffffffffffffff94,local_70);
              }
              else if ((*(JSModuleDef **)&in_RSI->header != in_stack_ffffffffffffff98) ||
                      (*(int *)(CONCAT44(in_stack_ffffffffffffff94,local_70) + 0x14) !=
                       *(int *)((long)&((*in_RDX)->link).next + 4))) {
                (in_RSI->header).ref_count = 0;
                (in_RSI->header).field_0x4 = 0;
                (in_RSI->header).dummy1 = '\0';
                (in_RSI->header).dummy2 = 0;
                *in_RDX = (JSModuleDef *)0x0;
                return JS_RESOLVE_RES_AMBIGUOUS;
              }
            }
          }
          if (*in_RDX != (JSModuleDef *)0x0) {
            return JS_RESOLVE_RES_FOUND;
          }
        }
        local_4 = JS_RESOLVE_RES_NOT_FOUND;
      }
      else if (*(JSExportTypeEnum *)&(s_00->link).next == JS_EXPORT_TYPE_LOCAL) {
        *(JSModuleDef **)&in_RSI->header = in_RCX;
        *in_RDX = s_00;
        local_4 = JS_RESOLVE_RES_FOUND;
      }
      else if (*(JSAtom *)((long)&(s_00->link).next + 4) == 0x7d) {
        *(JSModuleDef **)&in_RSI->header = in_RCX;
        *in_RDX = s_00;
        local_4 = JS_RESOLVE_RES_FOUND;
      }
      else {
        local_4 = js_resolve_export1(in_RSI,in_RDX,(JSExportEntry **)in_RCX,
                                     (JSModuleDef *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                                     (JSAtom)((ulong)in_R9 >> 0x20),(JSResolveState *)s_00);
      }
    }
  }
  else {
    local_4 = JS_RESOLVE_RES_CIRCULAR;
  }
  return local_4;
}

Assistant:

static JSResolveResultEnum js_resolve_export1(JSContext *ctx,
                                              JSModuleDef **pmodule,
                                              JSExportEntry **pme,
                                              JSModuleDef *m,
                                              JSAtom export_name,
                                              JSResolveState *s)
{
    JSExportEntry *me;

    *pmodule = NULL;
    *pme = NULL;
    if (find_resolve_entry(s, m, export_name) >= 0)
        return JS_RESOLVE_RES_CIRCULAR;
    if (add_resolve_entry(ctx, s, m, export_name) < 0)
        return JS_RESOLVE_RES_EXCEPTION;
    me = find_export_entry(ctx, m, export_name);
    if (me) {
        if (me->export_type == JS_EXPORT_TYPE_LOCAL) {
            /* local export */
            *pmodule = m;
            *pme = me;
            return JS_RESOLVE_RES_FOUND;
        } else {
            /* indirect export */
            JSModuleDef *m1;
            m1 = m->req_module_entries[me->u.req_module_idx].module;
            if (me->local_name == JS_ATOM__star_) {
                /* export ns from */
                *pmodule = m;
                *pme = me;
                return JS_RESOLVE_RES_FOUND;
            } else {
                return js_resolve_export1(ctx, pmodule, pme, m1,
                                          me->local_name, s);
            }
        }
    } else {
        if (export_name != JS_ATOM_default) {
            /* not found in direct or indirect exports: try star exports */
            int i;

            for(i = 0; i < m->star_export_entries_count; i++) {
                JSStarExportEntry *se = &m->star_export_entries[i];
                JSModuleDef *m1, *res_m;
                JSExportEntry *res_me;
                JSResolveResultEnum ret;

                m1 = m->req_module_entries[se->req_module_idx].module;
                ret = js_resolve_export1(ctx, &res_m, &res_me, m1,
                                         export_name, s);
                if (ret == JS_RESOLVE_RES_AMBIGUOUS ||
                    ret == JS_RESOLVE_RES_EXCEPTION) {
                    return ret;
                } else if (ret == JS_RESOLVE_RES_FOUND) {
                    if (*pme != NULL) {
                        if (*pmodule != res_m ||
                            res_me->local_name != (*pme)->local_name) {
                            *pmodule = NULL;
                            *pme = NULL;
                            return JS_RESOLVE_RES_AMBIGUOUS;
                        }
                    } else {
                        *pmodule = res_m;
                        *pme = res_me;
                    }
                }
            }
            if (*pme != NULL)
                return JS_RESOLVE_RES_FOUND;
        }
        return JS_RESOLVE_RES_NOT_FOUND;
    }
}